

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

void Bac_NtkCollapse_rec(Bac_Ntk_t *pNew,Bac_Ntk_t *p,Vec_Int_t *vSigs)

{
  int iVar1;
  int iVar2;
  Bac_Ntk_t *p_00;
  bool bVar3;
  int local_30;
  int iTerm;
  int iObjNew;
  int iObj;
  int i;
  Vec_Int_t *vSigs_local;
  Bac_Ntk_t *p_local;
  Bac_Ntk_t *pNew_local;
  
  Bac_NtkStartCopies(p);
  iVar1 = Vec_IntSize(vSigs);
  iVar2 = Bac_NtkPiNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(vSigs) == Bac_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                  ,0x210,"void Bac_NtkCollapse_rec(Bac_Ntk_t *, Bac_Ntk_t *, Vec_Int_t *)");
  }
  for (iObjNew = 0; iVar1 = Bac_NtkPiNum(p), iObjNew < iVar1; iObjNew = iObjNew + 1) {
    iVar1 = Bac_NtkPi(p,iObjNew);
    iVar2 = Vec_IntEntry(vSigs,iObjNew);
    Bac_ObjSetCopy(p,iVar1,iVar2);
  }
  for (iTerm = 0; iVar1 = Bac_NtkObjNum(p), iTerm < iVar1; iTerm = iTerm + 1) {
    iVar1 = Bac_ObjIsBox(p,iTerm);
    if (iVar1 != 0) {
      iVar1 = Bac_ObjIsBoxPrim(p,iTerm);
      local_30 = iTerm;
      if (iVar1 == 0) {
        while( true ) {
          local_30 = local_30 + 1;
          iVar1 = Bac_NtkObjNum(p);
          bVar3 = false;
          if (local_30 < iVar1) {
            iVar1 = Bac_ObjIsBo(p,local_30);
            bVar3 = iVar1 != 0;
          }
          if (!bVar3) break;
          Bac_ObjAlloc(pNew,BAC_OBJ_BI,-1);
          Bac_ObjAlloc(pNew,BAC_BOX_BUF,-1);
          iVar1 = Bac_ObjAlloc(pNew,BAC_OBJ_BO,-1);
          Bac_ObjSetCopy(p,local_30,iVar1);
        }
      }
      else {
        Bac_BoxDup(pNew,p,iTerm);
      }
    }
  }
  iTerm = 0;
  do {
    iVar1 = Bac_NtkObjNum(p);
    if (iVar1 <= iTerm) {
      Vec_IntClear(vSigs);
      for (iObjNew = 0; iVar1 = Bac_NtkPoNum(p), iObjNew < iVar1; iObjNew = iObjNew + 1) {
        iVar1 = Bac_NtkPo(p,iObjNew);
        iVar1 = Bac_ObjFanin(p,iVar1);
        iVar1 = Bac_ObjCopy(p,iVar1);
        Vec_IntPush(vSigs,iVar1);
      }
      return;
    }
    iVar1 = Bac_ObjIsBox(p,iTerm);
    if (iVar1 != 0) {
      iVar1 = Bac_ObjIsBoxPrim(p,iTerm);
      local_30 = iTerm;
      if (iVar1 == 0) {
        Vec_IntClear(vSigs);
        while( true ) {
          local_30 = local_30 + -1;
          bVar3 = false;
          if (-1 < local_30) {
            iVar1 = Bac_ObjIsBi(p,local_30);
            bVar3 = iVar1 != 0;
          }
          if (!bVar3) break;
          iVar1 = Bac_ObjFanin(p,local_30);
          iVar1 = Bac_ObjCopy(p,iVar1);
          Vec_IntPush(vSigs,iVar1);
        }
        p_00 = Bac_BoxNtk(p,iTerm);
        Bac_NtkCollapse_rec(pNew,p_00,vSigs);
        iVar1 = Vec_IntSize(vSigs);
        iVar2 = Bac_BoxBoNum(p,iTerm);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_IntSize(vSigs) == Bac_BoxBoNum(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                        ,0x22e,"void Bac_NtkCollapse_rec(Bac_Ntk_t *, Bac_Ntk_t *, Vec_Int_t *)");
        }
        iObjNew = 0;
        local_30 = iTerm;
        while( true ) {
          local_30 = local_30 + 1;
          iVar1 = Bac_NtkObjNum(p);
          bVar3 = false;
          if (local_30 < iVar1) {
            iVar1 = Bac_ObjIsBo(p,local_30);
            bVar3 = iVar1 != 0;
          }
          if (!bVar3) break;
          iVar1 = Bac_ObjCopy(p,local_30);
          iVar2 = Vec_IntEntry(vSigs,iObjNew);
          Bac_ObjSetFanin(pNew,iVar1 + -2,iVar2);
          iObjNew = iObjNew + 1;
        }
      }
      else {
        while( true ) {
          local_30 = local_30 + -1;
          bVar3 = false;
          if (-1 < local_30) {
            iVar1 = Bac_ObjIsBi(p,local_30);
            bVar3 = iVar1 != 0;
          }
          if (!bVar3) break;
          iVar1 = Bac_ObjCopy(p,local_30);
          iVar2 = Bac_ObjFanin(p,local_30);
          iVar2 = Bac_ObjCopy(p,iVar2);
          Bac_ObjSetFanin(pNew,iVar1,iVar2);
        }
      }
    }
    iTerm = iTerm + 1;
  } while( true );
}

Assistant:

void Bac_NtkCollapse_rec( Bac_Ntk_t * pNew, Bac_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, iObj, iObjNew, iTerm;
    Bac_NtkStartCopies( p );
    // set PI copies
    assert( Vec_IntSize(vSigs) == Bac_NtkPiNum(p) );
    Bac_NtkForEachPi( p, iObj, i )
        Bac_ObjSetCopy( p, iObj, Vec_IntEntry(vSigs, i) );
    // duplicate internal objects and create buffers for hierarchy instances
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjIsBoxPrim( p, iObj ) )
            Bac_BoxDup( pNew, p, iObj );
        else
        {
            Bac_BoxForEachBo( p, iObj, iTerm, i )
            {
                iObjNew = Bac_ObjAlloc( pNew, BAC_OBJ_BI,  -1 );
                iObjNew = Bac_ObjAlloc( pNew, BAC_BOX_BUF, -1 ); // buffer
                iObjNew = Bac_ObjAlloc( pNew, BAC_OBJ_BO,  -1 );
                Bac_ObjSetCopy( p, iTerm, iObjNew );
            }
        }
    // duplicate user modules and connect objects
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjIsBoxPrim( p, iObj ) )
        {
            Bac_BoxForEachBi( p, iObj, iTerm, i )
                Bac_ObjSetFanin( pNew, Bac_ObjCopy(p, iTerm), Bac_ObjCopy(p, Bac_ObjFanin(p, iTerm)) );
        }
        else
        {
            Vec_IntClear( vSigs );
            Bac_BoxForEachBi( p, iObj, iTerm, i )
                Vec_IntPush( vSigs, Bac_ObjCopy(p, Bac_ObjFanin(p, iTerm)) );
            Bac_NtkCollapse_rec( pNew, Bac_BoxNtk(p, iObj), vSigs );
            assert( Vec_IntSize(vSigs) == Bac_BoxBoNum(p, iObj) );
            Bac_BoxForEachBo( p, iObj, iTerm, i )
                Bac_ObjSetFanin( pNew, Bac_ObjCopy(p, iTerm)-2, Vec_IntEntry(vSigs, i) );
        }
    // collect POs
    Vec_IntClear( vSigs );
    Bac_NtkForEachPo( p, iObj, i )
        Vec_IntPush( vSigs, Bac_ObjCopy(p, Bac_ObjFanin(p, iObj)) );
}